

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hevc.cpp
# Opt level: O0

int __thiscall HevcVpsUnit::deserialize(HevcVpsUnit *this)

{
  uchar uVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int local_68;
  VodCoreException *e;
  int j;
  uint i_1;
  uint vps_num_layer_sets_minus1;
  int iStack_34;
  uchar vps_max_layer_id;
  uint vps_max_dec_pic_buffering_minus1;
  int i;
  bool vps_sub_layer_ordering_info_present_flag;
  uint8_t vps_max_sub_layers;
  int rez;
  HevcVpsUnit *this_local;
  
  this_local._4_4_ = HevcUnit::deserialize((HevcUnit *)this);
  if (this_local._4_4_ == 0) {
    BitStreamReader::skipBits(&(this->super_HevcUnitWithProfile).super_HevcUnit.m_reader,0xc);
    uVar1 = BitStreamReader::getBits<unsigned_char>
                      (&(this->super_HevcUnitWithProfile).super_HevcUnit.m_reader,3);
    bVar3 = uVar1 + 1;
    if (bVar3 < 8) {
      BitStreamReader::skipBits(&(this->super_HevcUnitWithProfile).super_HevcUnit.m_reader,0x11);
      iVar4 = HevcUnitWithProfile::profile_tier_level(&this->super_HevcUnitWithProfile,(uint)bVar3);
      if (iVar4 == 0) {
        bVar2 = BitStreamReader::getBit(&(this->super_HevcUnitWithProfile).super_HevcUnit.m_reader);
        if (bVar2) {
          local_68 = 0;
        }
        else {
          local_68 = bVar3 - 1;
        }
        for (iStack_34 = local_68; iStack_34 <= (int)(bVar3 - 1); iStack_34 = iStack_34 + 1) {
          uVar5 = HevcUnit::extractUEGolombCode((HevcUnit *)this);
          uVar6 = HevcUnit::extractUEGolombCode((HevcUnit *)this);
          if (uVar5 < uVar6) {
            return 1;
          }
          uVar5 = HevcUnit::extractUEGolombCode((HevcUnit *)this);
          if (uVar5 == 0xffffffff) {
            return 1;
          }
        }
        bVar3 = BitStreamReader::getBits<unsigned_char>
                          (&(this->super_HevcUnitWithProfile).super_HevcUnit.m_reader,6);
        uVar5 = HevcUnit::extractUEGolombCode((HevcUnit *)this);
        if (uVar5 < 0x400) {
          for (e._4_4_ = 1; e._4_4_ <= uVar5; e._4_4_ = e._4_4_ + 1) {
            for (e._0_4_ = 0; (int)e <= (int)(uint)bVar3; e._0_4_ = (int)e + 1) {
              BitStreamReader::skipBit(&(this->super_HevcUnitWithProfile).super_HevcUnit.m_reader);
            }
          }
          bVar2 = BitStreamReader::getBit
                            (&(this->super_HevcUnitWithProfile).super_HevcUnit.m_reader);
          if (bVar2) {
            iVar4 = BitStreamReader::getBitsCount
                              (&(this->super_HevcUnitWithProfile).super_HevcUnit.m_reader);
            this->num_units_in_tick_bit_pos = iVar4;
            uVar5 = BitStreamReader::getBits
                              (&(this->super_HevcUnitWithProfile).super_HevcUnit.m_reader,0x20);
            this->num_units_in_tick = uVar5;
            uVar5 = BitStreamReader::getBits
                              (&(this->super_HevcUnitWithProfile).super_HevcUnit.m_reader,0x20);
            this->time_scale = uVar5;
          }
        }
        else {
          this_local._4_4_ = 1;
        }
      }
      else {
        this_local._4_4_ = 1;
      }
    }
    else {
      this_local._4_4_ = 1;
    }
  }
  return this_local._4_4_;
}

Assistant:

int HevcVpsUnit::deserialize()
{
    const int rez = HevcUnit::deserialize();
    if (rez)
        return rez;

    try
    {
        m_reader.skipBits(12);  // vps_id, reserved, vps_max_layers
        const uint8_t vps_max_sub_layers = m_reader.getBits<uint8_t>(3) + 1;
        if (vps_max_sub_layers > 7)
            return 1;
        m_reader.skipBits(17);  // vps_temporal_id_nesting_flag, vps_reserved_0xffff_16bits
        if (profile_tier_level(vps_max_sub_layers) != 0)
            return 1;

        const bool vps_sub_layer_ordering_info_present_flag = m_reader.getBit();
        for (int i = (vps_sub_layer_ordering_info_present_flag ? 0 : vps_max_sub_layers - 1);
             i <= vps_max_sub_layers - 1; i++)
        {
            const unsigned vps_max_dec_pic_buffering_minus1 = extractUEGolombCode();
            if (extractUEGolombCode() > vps_max_dec_pic_buffering_minus1)  // vps_max_num_reorder_pics
                return 1;
            if (extractUEGolombCode() == UINT_MAX)  // vps_max_latency_increase_plus1
                return 1;
        }
        const auto vps_max_layer_id = m_reader.getBits<uint8_t>(6);
        const unsigned vps_num_layer_sets_minus1 = extractUEGolombCode();
        if (vps_num_layer_sets_minus1 > 1023)
            return 1;
        for (unsigned i = 1; i <= vps_num_layer_sets_minus1; i++)
        {
            for (int j = 0; j <= vps_max_layer_id; j++) m_reader.skipBit();  // layer_id_included_flag[ i ][ j ] u(1)
        }
        if (m_reader.getBit())  // vps_timing_info_present_flag
        {
            num_units_in_tick_bit_pos = m_reader.getBitsCount();
            num_units_in_tick = m_reader.getBits(32);
            time_scale = m_reader.getBits(32);
        }

        return rez;
    }
    catch (VodCoreException& e)
    {
        (void)e;
        return NOT_ENOUGH_BUFFER;
    }
}